

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

uint __thiscall
QXmlStreamReaderPrivate::resolveCharRef(QXmlStreamReaderPrivate *this,int symbolIndex)

{
  Value *pVVar1;
  uint uVar2;
  QString *this_00;
  qulonglong qVar3;
  bool *ok_00;
  long lVar4;
  long lVar5;
  char16_t *pcVar6;
  uint in_R8D;
  long in_FS_OFFSET;
  bool bVar7;
  QStringView string;
  bool ok;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 1;
  pVVar1 = this->sym_stack;
  lVar4 = (long)symbolIndex + (long)this->tos;
  lVar5 = (long)pVVar1[lVar4 + -1].prefix;
  if (pVVar1[lVar4 + -1].c == 0x78) {
    this_00 = (QString *)(pVVar1[lVar4 + -1].len - (lVar5 + 1));
    pcVar6 = (this->textBuffer).d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = L"";
    }
    pcVar6 = pcVar6 + lVar5 + pVVar1[lVar4 + -1].pos + 1;
    ok_00 = (bool *)0x10;
  }
  else {
    this_00 = (QString *)(pVVar1[lVar4 + -1].len - lVar5);
    pcVar6 = (this->textBuffer).d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = L"";
    }
    pcVar6 = pcVar6 + pVVar1[lVar4 + -1].pos + lVar5;
    ok_00 = (bool *)0xa;
  }
  string.m_data = (storage_type_conflict *)&local_9;
  string.m_size = (qsizetype)pcVar6;
  qVar3 = QString::toIntegral_helper(this_00,string,ok_00,in_R8D);
  if (qVar3 >> 0x20 != 0) {
    local_9 = 0;
    qVar3 = 0;
  }
  bVar7 = true;
  uVar2 = (uint)qVar3;
  if (((0xd < uVar2) || ((0x2600U >> (uVar2 & 0x1f) & 1) == 0)) &&
     (0x1ffd < uVar2 - 0xe000 && 0xd7df < uVar2 - 0x20)) {
    bVar7 = uVar2 - 0x10000 < 0x100000;
  }
  if ((local_9 & bVar7) == 0) {
    uVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint QXmlStreamReaderPrivate::resolveCharRef(int symbolIndex)
{
    bool ok = true;
    uint s;
    // ### add toXShort to XmlString?
    if (sym(symbolIndex).c == 'x')
        s = symString(symbolIndex, 1).view().toUInt(&ok, 16);
    else
        s = symString(symbolIndex).view().toUInt(&ok, 10);

    ok &= (s == 0x9 || s == 0xa || s == 0xd || (s >= 0x20 && s <= 0xd7ff)
           || (s >= 0xe000 && s <= 0xfffd) || (s >= 0x10000 && s <= QChar::LastValidCodePoint));

    return ok ? s : 0;
}